

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::string_view::operator_cast_to_string
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string_view *this)

{
  char *pcVar1;
  size_type sVar2;
  
  pcVar1 = this->ptr_;
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    sVar2 = this->length_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

explicit operator std::basic_string<char, traits_type, A>() const {
    if (!data()) return {};
    return std::basic_string<char, traits_type, A>(data(), size());
  }